

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_adaptor_extract_secret
              (secp256k1_context *ctx,uchar *adaptor_secret32,secp256k1_ecdsa_signature *sig,
              uchar *adaptor_sig65,secp256k1_pubkey *adaptor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  secp256k1_scalar adaptor_secret;
  secp256k1_scalar s;
  secp256k1_scalar sp;
  secp256k1_gej adaptor_expected_gej;
  secp256k1_ge adaptor_expected_ge;
  secp256k1_scalar local_1a8;
  secp256k1_scalar local_188;
  secp256k1_scalar local_168;
  undefined1 local_148 [128];
  secp256k1_ge_storage local_c8;
  secp256k1_ge local_88;
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_ecdsa_adaptor_extract_secret_cold_5();
  }
  else if (adaptor_secret32 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_extract_secret_cold_4();
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_adaptor_extract_secret_cold_3();
  }
  else if (adaptor_sig65 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_extract_secret_cold_2();
  }
  else {
    if (adaptor != (secp256k1_pubkey *)0x0) {
      secp256k1_scalar_set_b32(&local_168,adaptor_sig65 + 0x21,(int *)local_148);
      if (local_148._0_4_ != 0) {
        return 0;
      }
      local_188.d[0] = *(uint64_t *)(sig->data + 0x20);
      local_188.d[1] = *(uint64_t *)(sig->data + 0x28);
      local_188.d[2] = *(uint64_t *)(sig->data + 0x30);
      local_188.d[3] = *(uint64_t *)(sig->data + 0x38);
      secp256k1_scalar_inverse(&local_1a8,&local_188);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_1a8.d[0];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_168.d[0];
      uVar36 = SUB168(auVar1 * auVar17,8);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar36;
      local_148._0_8_ = SUB168(auVar1 * auVar17,0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_1a8.d[0];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_168.d[1];
      auVar2 = auVar2 * auVar18;
      uVar41 = SUB168(auVar2 + auVar33,0);
      uVar46 = SUB168(auVar2 + auVar33,8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_1a8.d[1];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_168.d[0];
      uVar37 = SUB168(auVar3 * auVar19,8);
      uVar35 = SUB168(auVar3 * auVar19,0);
      local_148._8_8_ = uVar41 + uVar35;
      uVar35 = (ulong)CARRY8(uVar41,uVar35);
      uVar41 = uVar46 + uVar37;
      uVar47 = uVar41 + uVar35;
      uVar48 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar36,auVar2._0_8_)) +
               (ulong)(CARRY8(uVar46,uVar37) || CARRY8(uVar41,uVar35));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_1a8.d[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_168.d[2];
      uVar38 = SUB168(auVar4 * auVar20,8);
      uVar35 = SUB168(auVar4 * auVar20,0);
      uVar36 = uVar47 + uVar35;
      uVar35 = (ulong)CARRY8(uVar47,uVar35);
      uVar37 = uVar48 + uVar38;
      uVar49 = uVar37 + uVar35;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_1a8.d[1];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_168.d[1];
      uVar39 = SUB168(auVar5 * auVar21,8);
      uVar41 = SUB168(auVar5 * auVar21,0);
      uVar47 = uVar36 + uVar41;
      uVar41 = (ulong)CARRY8(uVar36,uVar41);
      uVar46 = uVar49 + uVar39;
      uVar50 = uVar46 + uVar41;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1a8.d[2];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_168.d[0];
      uVar40 = SUB168(auVar6 * auVar22,8);
      uVar36 = SUB168(auVar6 * auVar22,0);
      local_148._16_8_ = uVar47 + uVar36;
      uVar36 = (ulong)CARRY8(uVar47,uVar36);
      uVar47 = uVar50 + uVar40;
      uVar51 = uVar47 + uVar36;
      uVar42 = (ulong)(CARRY8(uVar48,uVar38) || CARRY8(uVar37,uVar35)) +
               (ulong)(CARRY8(uVar49,uVar39) || CARRY8(uVar46,uVar41)) +
               (ulong)(CARRY8(uVar50,uVar40) || CARRY8(uVar47,uVar36));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_1a8.d[0];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_168.d[3];
      uVar40 = SUB168(auVar7 * auVar23,8);
      uVar35 = SUB168(auVar7 * auVar23,0);
      uVar36 = uVar51 + uVar35;
      uVar35 = (ulong)CARRY8(uVar51,uVar35);
      uVar46 = uVar42 + uVar40;
      uVar51 = uVar46 + uVar35;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1a8.d[1];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_168.d[2];
      uVar48 = SUB168(auVar8 * auVar24,8);
      uVar41 = SUB168(auVar8 * auVar24,0);
      uVar37 = uVar36 + uVar41;
      uVar41 = (ulong)CARRY8(uVar36,uVar41);
      uVar47 = uVar51 + uVar48;
      uVar43 = uVar47 + uVar41;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_1a8.d[2];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_168.d[1];
      uVar49 = SUB168(auVar9 * auVar25,8);
      uVar36 = SUB168(auVar9 * auVar25,0);
      uVar39 = uVar37 + uVar36;
      uVar36 = (ulong)CARRY8(uVar37,uVar36);
      uVar38 = uVar43 + uVar49;
      uVar44 = uVar38 + uVar36;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_1a8.d[3];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_168.d[0];
      uVar50 = SUB168(auVar10 * auVar26,8);
      uVar37 = SUB168(auVar10 * auVar26,0);
      local_148._24_8_ = uVar39 + uVar37;
      uVar37 = (ulong)CARRY8(uVar39,uVar37);
      uVar39 = uVar44 + uVar50;
      uVar45 = uVar39 + uVar37;
      uVar48 = (ulong)(CARRY8(uVar42,uVar40) || CARRY8(uVar46,uVar35)) +
               (ulong)(CARRY8(uVar51,uVar48) || CARRY8(uVar47,uVar41)) +
               (ulong)(CARRY8(uVar43,uVar49) || CARRY8(uVar38,uVar36)) +
               (ulong)(CARRY8(uVar44,uVar50) || CARRY8(uVar39,uVar37));
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_1a8.d[1];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_168.d[3];
      uVar38 = SUB168(auVar11 * auVar27,8);
      uVar35 = SUB168(auVar11 * auVar27,0);
      uVar36 = uVar45 + uVar35;
      uVar35 = (ulong)CARRY8(uVar45,uVar35);
      uVar37 = uVar48 + uVar38;
      uVar49 = uVar37 + uVar35;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_1a8.d[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_168.d[2];
      uVar39 = SUB168(auVar12 * auVar28,8);
      uVar41 = SUB168(auVar12 * auVar28,0);
      uVar47 = uVar36 + uVar41;
      uVar41 = (ulong)CARRY8(uVar36,uVar41);
      uVar46 = uVar49 + uVar39;
      uVar50 = uVar46 + uVar41;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_1a8.d[3];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_168.d[1];
      uVar40 = SUB168(auVar13 * auVar29,8);
      uVar36 = SUB168(auVar13 * auVar29,0);
      local_148._32_8_ = uVar47 + uVar36;
      uVar36 = (ulong)CARRY8(uVar47,uVar36);
      uVar47 = uVar50 + uVar40;
      uVar42 = uVar47 + uVar36;
      uVar38 = (ulong)(CARRY8(uVar48,uVar38) || CARRY8(uVar37,uVar35)) +
               (ulong)(CARRY8(uVar49,uVar39) || CARRY8(uVar46,uVar41)) +
               (ulong)(CARRY8(uVar50,uVar40) || CARRY8(uVar47,uVar36));
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_1a8.d[2];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_168.d[3];
      uVar46 = SUB168(auVar14 * auVar30,8);
      uVar35 = SUB168(auVar14 * auVar30,0);
      uVar37 = uVar42 + uVar35;
      uVar35 = (ulong)CARRY8(uVar42,uVar35);
      uVar36 = uVar38 + uVar46;
      uVar39 = uVar36 + uVar35;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_1a8.d[3];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_168.d[2];
      uVar47 = SUB168(auVar15 * auVar31,8);
      uVar41 = SUB168(auVar15 * auVar31,0);
      local_148._40_8_ = uVar37 + uVar41;
      uVar41 = (ulong)CARRY8(uVar37,uVar41);
      uVar37 = uVar39 + uVar47;
      local_148._56_8_ =
           (ulong)(CARRY8(uVar38,uVar46) || CARRY8(uVar36,uVar35)) +
           (ulong)(CARRY8(uVar39,uVar47) || CARRY8(uVar37,uVar41));
      local_148._48_8_ = uVar37 + uVar41;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_1a8.d[3];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_168.d[3];
      local_148._48_16_ = auVar16 * auVar32 + local_148._48_16_;
      secp256k1_scalar_reduce_512(&local_1a8,(uint64_t *)local_148);
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)local_148,&local_1a8);
      secp256k1_ge_set_gej(&local_88,(secp256k1_gej *)local_148);
      secp256k1_ge_to_storage(&local_c8,&local_88);
      iVar34 = bcmp(&local_c8,adaptor,0x40);
      if (iVar34 != 0) {
        secp256k1_scalar_negate(&local_1a8,&local_1a8);
      }
      secp256k1_scalar_get_b32(adaptor_secret32,&local_1a8);
      return 1;
    }
    secp256k1_ecdsa_adaptor_extract_secret_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_extract_secret(const secp256k1_context* ctx, unsigned char *adaptor_secret32, const secp256k1_ecdsa_signature *sig, const unsigned char *adaptor_sig65, const secp256k1_pubkey *adaptor) {
    secp256k1_scalar sp;
    secp256k1_scalar s, r;
    secp256k1_scalar adaptor_secret;
    secp256k1_ge adaptor_expected_ge;
    secp256k1_gej adaptor_expected_gej;
    secp256k1_pubkey adaptor_expected;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_secret32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(adaptor_sig65 != NULL);
    ARG_CHECK(adaptor != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(NULL, NULL, &sp, adaptor_sig65)) {
        return 0;
    }
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    secp256k1_scalar_inverse(&adaptor_secret, &s);
    secp256k1_scalar_mul(&adaptor_secret, &adaptor_secret, &sp);

    /* Deal with ECDSA malleability */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &adaptor_expected_gej, &adaptor_secret);
    secp256k1_ge_set_gej(&adaptor_expected_ge, &adaptor_expected_gej);
    secp256k1_pubkey_save(&adaptor_expected, &adaptor_expected_ge);
    if (memcmp(&adaptor_expected, adaptor, sizeof(adaptor_expected)) != 0) {
        secp256k1_scalar_negate(&adaptor_secret, &adaptor_secret);
    }
    secp256k1_scalar_get_b32(adaptor_secret32, &adaptor_secret);

    secp256k1_scalar_clear(&adaptor_secret);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return 1;
}